

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

QByteArray * QTimeZone::systemTimeZoneId(void)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  longlong __old_val;
  Type *pTVar4;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *in_RDI;
  QArrayDataPointer<char> *this;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  this = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
           operator->(in_RDI);
  (*((pTVar4->backend).d.ptr)->_vptr_QTimeZonePrivate[0x13])();
  qVar3 = local_38.size;
  pcVar2 = local_38.ptr;
  pDVar1 = local_38.d;
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::
             operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>
                         *)this);
    QTimeZonePrivate::id((QByteArray *)in_RDI,(pTVar4->backend).d.ptr);
  }
  else {
    local_38.d = (Data *)0x0;
    local_38.ptr = (char *)0x0;
    *(Data **)in_RDI = pDVar1;
    *(char **)(in_RDI + 8) = pcVar2;
    local_38.size = 0;
    *(qsizetype *)(in_RDI + 0x10) = qVar3;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZone::systemTimeZoneId()
{
    QByteArray sys = global_tz->backend->systemTimeZoneId();
    if (!sys.isEmpty())
        return sys;
    // The system zone, despite the empty ID, may know its real ID anyway:
    return global_tz->backend->id();
}